

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteSFixed64
               (int field_number,int64 value,CodedOutputStream *output)

{
  int64 *piVar1;
  bool bVar2;
  uint uVar3;
  uint8 *puVar4;
  uint uVar5;
  byte *pbVar6;
  byte *pbVar7;
  
  uVar5 = field_number << 3;
  if ((output->impl_).end_ <= output->cur_) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
    output->cur_ = puVar4;
  }
  pbVar6 = output->cur_;
  if (uVar5 < 0x80) {
    *pbVar6 = (byte)uVar5 | 1;
    pbVar6 = pbVar6 + 1;
  }
  else {
    *pbVar6 = (byte)uVar5 | 0x81;
    if (uVar5 < 0x4000) {
      pbVar6[1] = (byte)(uVar5 >> 7);
      pbVar6 = pbVar6 + 2;
    }
    else {
      pbVar6 = pbVar6 + 2;
      uVar5 = uVar5 >> 7;
      do {
        pbVar7 = pbVar6;
        pbVar7[-1] = (byte)uVar5 | 0x80;
        uVar3 = uVar5 >> 7;
        pbVar6 = pbVar7 + 1;
        bVar2 = 0x3fff < uVar5;
        uVar5 = uVar3;
      } while (bVar2);
      *pbVar7 = (byte)uVar3;
    }
  }
  output->cur_ = pbVar6;
  if ((output->impl_).end_ <= pbVar6) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
    output->cur_ = puVar4;
  }
  piVar1 = (int64 *)output->cur_;
  *piVar1 = value;
  output->cur_ = (uint8 *)(piVar1 + 1);
  return;
}

Assistant:

void WireFormatLite::WriteSFixed64(int field_number, int64 value,
                                   io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED64, output);
  WriteSFixed64NoTag(value, output);
}